

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamIGA.h
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamIGA::EvaluateSectionFrame
          (ChElementBeamIGA *this,double eta,ChVector<double> *point,ChQuaternion<double> *rot)

{
  ChVectorDynamic<> *this_00;
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int i_00;
  long lVar8;
  pointer psVar9;
  Scalar *pSVar10;
  int i;
  ulong uVar11;
  int i_1;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ChVectorDynamic<> N;
  Matrix<double,__1,_1,_0,__1,_1> local_68;
  ulong local_58;
  ulong local_50;
  ChVector<double> local_48;
  
  this_00 = &this->knots;
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                       (long)this->order);
  dVar1 = *pSVar10;
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                       ~(long)this->order +
                       (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar1;
  i_00 = this->order;
  local_48.m_data[0] =
       (double)CONCAT44(local_48.m_data[0]._4_4_,
                        (int)((ulong)((long)(this->nodes).
                                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->nodes).
                                           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 4));
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *pSVar10 - dVar1;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = (eta + 1.0) * 0.5;
  auVar13 = vfmadd213sd_fma(auVar13,auVar18,auVar23);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_68,(int *)&local_48);
  geometry::ChBasisToolsBspline::BasisEvaluate(this->order,i_00,auVar13._0_8_,this_00,&local_68);
  if (point != (ChVector<double> *)&VNULL) {
    point->m_data[0] = VNULL;
    point->m_data[1] = DAT_011dd3e0;
    point->m_data[2] = DAT_011dd3e8;
  }
  lVar12 = 0;
  for (uVar11 = 0;
      uVar11 < (ulong)((long)(this->nodes).
                             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->nodes).
                             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4); uVar11 = uVar11 + 1) {
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,
                         uVar11);
    local_48.m_data[1] = *pSVar10;
    lVar8 = *(long *)((long)&(((this->nodes).
                               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + lVar12);
    local_48.m_data[2] = local_48.m_data[1] * *(double *)(lVar8 + 0x30);
    local_48.m_data[0] = local_48.m_data[1] * *(double *)(lVar8 + 0x20);
    local_48.m_data[1] = local_48.m_data[1] * *(double *)(lVar8 + 0x28);
    ChVector<double>::operator+=(point,&local_48);
    lVar12 = lVar12 + 0x10;
  }
  ChQuaternion<double>::operator=(rot,(ChQuaternion<double> *)QNULL);
  lVar12 = 0;
  uVar11 = 0;
  while (psVar9 = (this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar11 < (ulong)((long)(this->nodes).
                               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)psVar9 >> 4)) {
    lVar8 = *(long *)((long)&(psVar9->
                             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + lVar12);
    uVar2 = *(ulong *)(lVar8 + 0x40);
    uVar3 = *(ulong *)(lVar8 + 0x38);
    local_50 = *(ulong *)(lVar8 + 0x48);
    local_58 = *(ulong *)(lVar8 + 0x50);
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,
                         uVar11);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = *pSVar10;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar3;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = rot->m_data[0];
    auVar13 = vfmadd213sd_fma(auVar19,auVar14,auVar4);
    rot->m_data[0] = auVar13._0_8_;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,
                         uVar11);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = *pSVar10;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar2;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = rot->m_data[1];
    auVar13 = vfmadd213sd_fma(auVar20,auVar15,auVar5);
    rot->m_data[1] = auVar13._0_8_;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,
                         uVar11);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = *pSVar10;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = local_50;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = rot->m_data[2];
    auVar13 = vfmadd213sd_fma(auVar21,auVar16,auVar6);
    rot->m_data[2] = auVar13._0_8_;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,
                         uVar11);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = *pSVar10;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_58;
    uVar11 = uVar11 + 1;
    lVar12 = lVar12 + 0x10;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = rot->m_data[3];
    auVar13 = vfmadd213sd_fma(auVar22,auVar17,auVar7);
    rot->m_data[3] = auVar13._0_8_;
  }
  ChQuaternion<double>::Normalize(rot);
  Eigen::internal::handmade_aligned_free
            (local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
  return;
}

Assistant:

virtual void EvaluateSectionFrame(const double eta, ChVector<>& point, ChQuaternion<>& rot) override {
        // compute parameter in knot space from eta-1..+1

        double u1 = knots(order);  // extreme of span
        double u2 = knots(knots.size() - order - 1);
        double u = u1 + ((eta + 1) / 2.0) * (u2 - u1);
        int nspan = order;

        ChVectorDynamic<> N((int)nodes.size());

        geometry::ChBasisToolsBspline::BasisEvaluate(this->order, nspan, u, knots,
                                                     N);  ///< here return  in N

        point = VNULL;
        for (int i = 0; i < nodes.size(); ++i) {
            point += N(i) * nodes[i]->coord.pos;
        }
        rot = QNULL;
        for (int i = 0; i < nodes.size(); ++i) {
            ChQuaternion<> myrot = nodes[i]->coord.rot;
            rot.e0() += N(i) * myrot.e0();
            rot.e1() += N(i) * myrot.e1();
            rot.e2() += N(i) * myrot.e2();
            rot.e3() += N(i) * myrot.e3();
        }
        rot.Normalize();
    }